

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlyANSIPortDecl.cpp
# Opt level: O2

bool __thiscall OnlyANSIPortDecl::check(OnlyANSIPortDecl *this,RootSymbol *root)

{
  MainVisitor visitor;
  TidyVisitor local_30;
  
  TidyVisitor::TidyVisitor(&local_30,&(this->super_TidyCheck).diagnostics);
  slang::ast::Symbol::visit<no_ansi_port_decl::MainVisitor&>
            (&root->super_Symbol,(MainVisitor *)&local_30);
  return (this->super_TidyCheck).diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
         super_SmallVectorBase<slang::Diagnostic>.len == 0;
}

Assistant:

bool check(const ast::RootSymbol& root) override {
        MainVisitor visitor(diagnostics);
        root.visit(visitor);
        return diagnostics.empty();
    }